

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZParFrontMatrix.h
# Opt level: O0

void __thiscall
TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZParFrontMatrix
          (TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *this,
          TPZParFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *cp)

{
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *in_RSI;
  TPZRegisterClassId *in_RDI;
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_> *unaff_retaddr;
  TPZStack<TPZEqnArray<double>_*,_10> *in_stack_ffffffffffffffd0;
  int64_t newsize;
  TPZRegisterClassId *vtt;
  
  newsize = 0;
  vtt = in_RDI;
  TPZRegisterClassId::
  TPZRegisterClassId<TPZParFrontMatrix<double,TPZFileEqnStorage<double>,TPZFrontNonSym<double>>>
            (in_RDI,0x21);
  TPZFrontMatrix<double,_TPZFileEqnStorage<double>,_TPZFrontNonSym<double>_>::TPZFrontMatrix
            (unaff_retaddr,(void **)vtt,in_RSI);
  *(undefined ***)in_RDI = &PTR__TPZParFrontMatrix_02553390;
  TPZStack<TPZEqnArray<double>_*,_10>::TPZStack(in_stack_ffffffffffffffd0);
  *(undefined4 *)(in_RDI + 0x2c0) = 0;
  *(undefined8 *)(in_RDI + 0x2d8) = 0;
  *(undefined8 *)(in_RDI + 0x2e0) = 0;
  *(undefined8 *)(in_RDI + 0x2c8) = 0;
  *(undefined8 *)(in_RDI + 0x2d0) = 0;
  *(undefined8 *)(in_RDI + 0x2e8) = 0;
  std::mutex::mutex((mutex *)0x1d3db93);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x2f0));
  TPZManVector<TPZEqnArray<double>_*,_10>::Resize
            ((TPZManVector<TPZEqnArray<double>_*,_10> *)in_RSI,newsize);
  return;
}

Assistant:

TPZParFrontMatrix(const TPZParFrontMatrix &cp) : TPZRegisterClassId(&TPZParFrontMatrix::ClassId),
    TPZFrontMatrix<TVar, store,front>(cp), fFinish(0), fwritelock(), fwritecond()
	{
        fEqnStack.Resize(0);
	}